

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib586.c
# Opt level: O0

void my_unlock(CURL *handle,curl_lock_data data,void *useptr)

{
  userdata *user;
  char *what;
  void *useptr_local;
  curl_lock_data data_local;
  CURL *handle_local;
  
  switch(data) {
  case CURL_LOCK_DATA_SHARE:
    user = (userdata *)anon_var_dwarf_1b1;
    break;
  case CURL_LOCK_DATA_COOKIE:
    user = (userdata *)anon_var_dwarf_1dd;
    break;
  case CURL_LOCK_DATA_DNS:
    user = (userdata *)anon_var_dwarf_1c7;
    break;
  case CURL_LOCK_DATA_SSL_SESSION:
    user = (userdata *)anon_var_dwarf_1f3;
    break;
  default:
    curl_mfprintf(_stderr,"unlock: no such data: %d\n",data);
    return;
  }
  curl_mprintf("unlock: %-6s [%s]: %d\n",user,*useptr,*(undefined4 *)((long)useptr + 8));
  *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
  return;
}

Assistant:

static void my_unlock(CURL *handle, curl_lock_data data, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  (void)handle;
  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      break;
    case CURL_LOCK_DATA_SSL_SESSION:
      what = "ssl_session";
      break;
    default:
      fprintf(stderr, "unlock: no such data: %d\n", (int)data);
      return;
  }
  printf("unlock: %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}